

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void __thiscall FM::OPNBase::SetPrescaler(OPNBase *this,uint p)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int i;
  long lVar4;
  
  if (this->prescale != p) {
    this->prescale = (uint8)p;
    if (2 < (p & 0xff)) {
      __assert_fail("prescale < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/np2/fmgen_opna.cpp"
                    ,0x78,"void FM::OPNBase::SetPrescaler(uint)");
    }
    uVar3 = this->psgrate;
    uVar1 = (ulong)this->clock / (ulong)(uint)(int)SetPrescaler::table[p][0];
    this->rate = uVar3;
    if (0xbffffff < (uint)uVar1) {
      __assert_fail("fmclock < (0x80000000 >> FM_RATIOBITS)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/np2/fmgen_opna.cpp"
                    ,0x7f,"void FM::OPNBase::SetPrescaler(uint)");
    }
    lVar4 = 0;
    uVar3 = ((uVar3 >> 1) + (int)(uVar1 / 0xc) * 0x80) / uVar3;
    Timer::SetTimerBase(&this->super_Timer,(uint)(uVar1 / 0xc));
    Chip::SetRatio(&this->chip,uVar3);
    PSG::SetClock(&this->psg,this->clock / (uint)(int)SetPrescaler::table[p][1],this->psgrate);
    puVar2 = &lfotable;
    do {
      *puVar2 = (uVar3 << 9) / (uint)"lMGC>,\b\x05"[lVar4];
      lVar4 = lVar4 + 1;
      puVar2 = puVar2 + 1;
    } while (lVar4 != 8);
  }
  return;
}

Assistant:

void OPNBase::SetPrescaler(uint p)
{
	static const char table[3][2] = { { 6, 4 }, { 3, 2 }, { 2, 1 } };
	static const uint8 table2[8] = { 108,  77,  71,  67,  62,  44,  8,  5 };
	// 512
	if (prescale != p)
	{
		prescale = p;
		/*warning: comparison is always true due to limited range of data type [-Wtype-limits]*/
		// assert(0 <= prescale && prescale < 3);
		assert(prescale < 3);

		uint fmclock = clock / table[p][0] / 12;

		rate = psgrate;

		// �������g���Əo�͎��g���̔�
		assert(fmclock < (0x80000000 >> FM_RATIOBITS));
		uint ratio = ((fmclock << FM_RATIOBITS) + rate/2) / rate;

		SetTimerBase(fmclock);
//		MakeTimeTable(ratio);
		chip.SetRatio(ratio);
		psg.SetClock(clock / table[p][1], psgrate);

		for (int i=0; i<8; i++)
		{
			lfotable[i] = (ratio << (2+FM_LFOCBITS-FM_RATIOBITS)) / table2[i];
		}
	}
}